

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_211787::AlsaCapture::start(AlsaCapture *this)

{
  int iVar1;
  backend_exception *pbVar2;
  undefined8 uVar3;
  long in_RDI;
  int err;
  
  iVar1 = (*(anonymous_namespace)::psnd_pcm_prepare)(*(undefined8 *)(in_RDI + 0x10));
  if (iVar1 < 0) {
    pbVar2 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar3 = (*(anonymous_namespace)::psnd_strerror)(iVar1);
    al::backend_exception::backend_exception(pbVar2,0xa004,"snd_pcm_prepare failed: %s",uVar3);
    __cxa_throw(pbVar2,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  iVar1 = (*(anonymous_namespace)::psnd_pcm_start)(*(undefined8 *)(in_RDI + 0x10));
  if (iVar1 < 0) {
    pbVar2 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar3 = (*(anonymous_namespace)::psnd_strerror)(iVar1);
    al::backend_exception::backend_exception(pbVar2,0xa004,"snd_pcm_start failed: %s",uVar3);
    __cxa_throw(pbVar2,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  *(undefined1 *)(in_RDI + 0x30) = 1;
  return;
}

Assistant:

void AlsaCapture::start()
{
    int err{snd_pcm_prepare(mPcmHandle)};
    if(err < 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "snd_pcm_prepare failed: %s",
            snd_strerror(err)};

    err = snd_pcm_start(mPcmHandle);
    if(err < 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "snd_pcm_start failed: %s",
            snd_strerror(err)};

    mDoCapture = true;
}